

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int lyd_wd_toprint(lyd_node *node,int options)

{
  byte bVar1;
  long lVar2;
  lyd_node_leaf_list *plVar3;
  bool bVar4;
  int iVar5;
  LYS_NODE LVar6;
  lys_node *plVar7;
  lyd_node *plVar8;
  lyd_node_leaf_list *node_00;
  lyd_node *plVar9;
  lyd_node *plVar10;
  lyd_node *plVar11;
  lyd_node_leaf_list *plVar12;
  lyd_node **pplVar13;
  
  bVar1 = node->field_0x9;
  if ((options & 0x10U) == 0) {
    if ((options & 0xe0U) == 0 && (bVar1 & 1) != 0) {
      plVar7 = node->schema;
      plVar8 = node;
      if ((plVar7->flags & 2) == 0) {
        while( true ) {
          if (plVar8 == (lyd_node *)0x0) {
            return 0;
          }
          if ((plVar8->schema->flags & 2) != 0) break;
          plVar9 = plVar8->child;
          plVar11 = plVar8;
          if (plVar9 != (lyd_node *)0x0 &&
              (plVar8->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)
          goto LAB_0015f4f6;
          if (plVar8 == node) {
            return 0;
          }
          do {
            plVar9 = plVar11->next;
LAB_0015f4f6:
            plVar8 = plVar9;
          } while ((plVar9 == (lyd_node *)0x0) &&
                  (plVar11 = plVar11->parent, plVar11->parent != node->parent));
        }
        return 1;
      }
    }
    else {
      if ((bVar1 & 1) == 0) {
        return 1;
      }
      plVar7 = node->schema;
    }
    if (((options & 4U) == 0) && (plVar8 = node, plVar7->nodetype == LYS_CONTAINER)) {
      while( true ) {
        if (plVar8 == (lyd_node *)0x0) {
          return 0;
        }
        if (plVar8->schema->nodetype != LYS_CONTAINER) break;
        plVar9 = plVar8->child;
        plVar11 = plVar8;
        if (plVar9 == (lyd_node *)0x0) {
          plVar10 = plVar8;
          if (plVar8 != node) goto LAB_0015f595;
          return 0;
        }
        while ((plVar8 = plVar9, plVar9 == (lyd_node *)0x0 &&
               (plVar10 = plVar11->parent, plVar11->parent->parent != node->parent))) {
LAB_0015f595:
          plVar9 = plVar10->next;
          plVar11 = plVar10;
        }
      }
    }
  }
  else {
    if ((bVar1 & 1) != 0) {
      return 0;
    }
    plVar7 = node->schema;
    if ((plVar7->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      if (((plVar7->nodetype & LYS_CONTAINER) != LYS_UNKNOWN) &&
         (lVar2._0_2_ = plVar7[1].flags, lVar2._2_1_ = plVar7[1].ext_size,
         lVar2._3_1_ = plVar7[1].iffeature_size, lVar2._4_1_ = plVar7[1].padding[0],
         lVar2._5_1_ = plVar7[1].padding[1], lVar2._6_1_ = plVar7[1].padding[2],
         lVar2._7_1_ = plVar7[1].padding[3], lVar2 == 0)) {
        pplVar13 = &node->child;
        bVar4 = false;
        while ((plVar3 = (lyd_node_leaf_list *)*pplVar13, plVar3 != (lyd_node_leaf_list *)0x0 &&
               (plVar12 = plVar3, !bVar4))) {
          while (node_00 = plVar12, bVar4 = false, node_00 != (lyd_node_leaf_list *)0x0) {
            if ((node_00->field_0x9 & 1) == 0) {
              LVar6 = node_00->schema->nodetype;
              if ((LVar6 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
                iVar5 = lyd_wd_default(node_00);
                if (iVar5 == 0) {
                  bVar4 = true;
                  break;
                }
                LVar6 = node_00->schema->nodetype;
              }
              if (((LVar6 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
                 (plVar12 = (lyd_node_leaf_list *)node_00->value_str,
                 plVar12 != (lyd_node_leaf_list *)0x0)) goto LAB_0015f633;
            }
            if (node_00 == plVar3) break;
            do {
              plVar12 = (lyd_node_leaf_list *)node_00->next;
LAB_0015f633:
            } while ((plVar12 == (lyd_node_leaf_list *)0x0) &&
                    (node_00 = (lyd_node_leaf_list *)node_00->parent,
                    node_00->parent != plVar3->parent));
          }
          pplVar13 = &plVar3->next;
        }
        if (!bVar4) {
          return 0;
        }
      }
    }
    else {
      iVar5 = lyd_wd_default((lyd_node_leaf_list *)node);
      if (iVar5 != 0) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int
lyd_wd_toprint(const struct lyd_node *node, int options)
{
    const struct lyd_node *subroot, *next, *elem;
    int flag = 0;

    if (options & LYP_WD_TRIM) {
        /* do not print default nodes */
        if (node->dflt) {
            /* implicit default node */
            return 0;
        } else if (node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
            if (lyd_wd_default((struct lyd_node_leaf_list *)node)) {
                /* explicit default node */
                return 0;
            }
        } else if ((node->schema->nodetype & (LYS_CONTAINER)) && !((struct lys_node_container *)node->schema)->presence) {
            /* get know if non-presence container contains non-default node */
            for (subroot = node->child; subroot && !flag; subroot = subroot->next) {
                LY_TREE_DFS_BEGIN(subroot, next, elem) {
                    if (elem->dflt) {
                        /* skip subtree */
                        goto trim_dfs_nextsibling;
                    } else if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if (!lyd_wd_default((struct lyd_node_leaf_list *)elem)) {
                            /* non-default node */
                            flag = 1;
                            break;
                        }
                    }

                    /* modified LY_TREE_DFS_END */
                    /* select element for the next run - children first */
                    /* child exception for leafs, leaflists and anyxml without children */
                    if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        next = NULL;
                    } else {
                        next = elem->child;
                    }
                    if (!next) {
trim_dfs_nextsibling:
                        /* no children */
                        if (elem == subroot) {
                            /* we are done, (START) has no children */
                            break;
                        }
                        /* try siblings */
                        next = elem->next;
                    }
                    while (!next) {
                        /* parent is already processed, go to its sibling */
                        elem = elem->parent;
                        /* no siblings, go back through parents */
                        if (elem->parent == subroot->parent) {
                            /* we are done, no next element to process */
                            break;
                        }
                        next = elem->next;
                    }
                }
            }
            if (!flag) {
                /* only default nodes in subtree, do not print the container */
                return 0;
            }
        }
    } else if (node->dflt && !(options & LYP_WD_MASK) && !(node->schema->flags & LYS_CONFIG_R)) {
        /* LYP_WD_EXPLICIT
         * - print only if it contains status data in its subtree */
        LY_TREE_DFS_BEGIN(node, next, elem) {
            if (elem->schema->flags & LYS_CONFIG_R) {
                flag = 1;
                break;
            }
            LY_TREE_DFS_END(node, next, elem)
        }
        if (!flag) {
            return 0;
        }
    } else if (node->dflt && node->schema->nodetype == LYS_CONTAINER && !(options & LYP_KEEPEMPTYCONT)) {
        /* avoid empty default containers */
        LY_TREE_DFS_BEGIN(node, next, elem) {
            if (elem->schema->nodetype != LYS_CONTAINER) {
                flag = 1;
                break;
            }
            LY_TREE_DFS_END(node, next, elem)
        }
        if (!flag) {
            return 0;
        }
    }

    return 1;
}